

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::python::Generator::PrintDescriptor
          (Generator *this,Descriptor *message_descriptor)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  HasBits<1UL> *pHVar2;
  Printer *pPVar3;
  long lVar4;
  int iVar5;
  mapped_type *pmVar6;
  char *pcVar7;
  long lVar8;
  Syntax syntax;
  char *pcVar9;
  long lVar10;
  byte bVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  string options_string_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  DescriptorProto edp;
  string options_string;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  m;
  char required_function_arguments [91];
  
  bVar11 = 0;
  PrintNestedDescriptors(this,message_descriptor);
  io::Printer::Print<>(this->printer_,"\n");
  pPVar3 = this->printer_;
  ModuleLevelDescriptorName<google::protobuf::Descriptor>((string *)&edp,this,message_descriptor);
  io::Printer::Print<char[16],std::__cxx11::string>
            (pPVar3,"$descriptor_name$ = _descriptor.Descriptor(\n",(char (*) [16])0x3a1037,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&edp);
  pHVar2 = &edp._has_bits_;
  if (edp.super_Message.super_MessageLite._vptr_MessageLite != (MessageLite)pHVar2) {
    operator_delete((void *)edp.super_Message.super_MessageLite._vptr_MessageLite);
  }
  io::Printer::Indent(this->printer_);
  m._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &m._M_t._M_impl.super__Rb_tree_header._M_header;
  m._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  m._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  m._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  edp.super_Message.super_MessageLite._vptr_MessageLite = (MessageLite)(MessageLite)pHVar2;
  m._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       m._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::_M_construct<char_const*>((string *)&edp,"name","");
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&m,(key_type *)&edp);
  std::__cxx11::string::_M_assign((string *)pmVar6);
  if (edp.super_Message.super_MessageLite._vptr_MessageLite != (MessageLite)pHVar2) {
    operator_delete((void *)edp.super_Message.super_MessageLite._vptr_MessageLite);
  }
  edp.super_Message.super_MessageLite._vptr_MessageLite = (MessageLite)(MessageLite)pHVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&edp,"full_name","");
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&m,(key_type *)&edp);
  std::__cxx11::string::_M_assign((string *)pmVar6);
  if (edp.super_Message.super_MessageLite._vptr_MessageLite != (MessageLite)pHVar2) {
    operator_delete((void *)edp.super_Message.super_MessageLite._vptr_MessageLite);
  }
  edp.super_Message.super_MessageLite._vptr_MessageLite = (MessageLite)(MessageLite)pHVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&edp,"file","");
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&m,(key_type *)&edp);
  std::__cxx11::string::_M_replace((ulong)pmVar6,0,(char *)pmVar6->_M_string_length,0x3a06f8);
  if (edp.super_Message.super_MessageLite._vptr_MessageLite != (MessageLite)pHVar2) {
    operator_delete((void *)edp.super_Message.super_MessageLite._vptr_MessageLite);
  }
  pcVar7 = 
  "name=\'$name$\',\nfull_name=\'$full_name$\',\nfilename=None,\nfile=$file$,\ncontaining_type=None,\n"
  ;
  pcVar9 = required_function_arguments;
  for (lVar8 = 0xb; lVar8 != 0; lVar8 = lVar8 + -1) {
    *(undefined8 *)pcVar9 = *(undefined8 *)pcVar7;
    pcVar7 = pcVar7 + ((ulong)bVar11 * -2 + 1) * 8;
    pcVar9 = pcVar9 + (ulong)bVar11 * -0x10 + 8;
  }
  required_function_arguments[0x5a] = '\0';
  required_function_arguments[0x58] = ',';
  required_function_arguments[0x59] = '\n';
  io::Printer::Print(this->printer_,&m,required_function_arguments);
  PrintFieldsInDescriptor(this,message_descriptor);
  PrintExtensionsInDescriptor(this,message_descriptor);
  io::Printer::Print<>(this->printer_,"nested_types=[");
  if (0 < *(int *)(message_descriptor + 0x70)) {
    lVar10 = 0;
    lVar8 = 0;
    do {
      ModuleLevelDescriptorName<google::protobuf::Descriptor>
                ((string *)&edp,this,(Descriptor *)(*(long *)(message_descriptor + 0x38) + lVar10));
      io::Printer::Print<char[5],std::__cxx11::string>
                (this->printer_,"$name$, ",(char (*) [5])0x3918cc,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&edp);
      if (edp.super_Message.super_MessageLite._vptr_MessageLite != (MessageLite)&edp._has_bits_) {
        operator_delete((void *)edp.super_Message.super_MessageLite._vptr_MessageLite);
      }
      lVar8 = lVar8 + 1;
      lVar10 = lVar10 + 0x90;
    } while (lVar8 < *(int *)(message_descriptor + 0x70));
  }
  io::Printer::Print<>(this->printer_,"],\n");
  io::Printer::Print<>(this->printer_,"enum_types=[\n");
  io::Printer::Indent(this->printer_);
  if (0 < *(int *)(message_descriptor + 0x74)) {
    lVar10 = 0;
    lVar8 = 0;
    do {
      ModuleLevelDescriptorName<google::protobuf::EnumDescriptor>
                ((string *)&edp,this,
                 (EnumDescriptor *)(*(long *)(message_descriptor + 0x40) + lVar10));
      io::Printer::Print<>
                (this->printer_,(char *)edp.super_Message.super_MessageLite._vptr_MessageLite);
      io::Printer::Print<>(this->printer_,",\n");
      if (edp.super_Message.super_MessageLite._vptr_MessageLite != (MessageLite)&edp._has_bits_) {
        operator_delete((void *)edp.super_Message.super_MessageLite._vptr_MessageLite);
      }
      lVar8 = lVar8 + 1;
      lVar10 = lVar10 + 0x50;
    } while (lVar8 < *(int *)(message_descriptor + 0x74));
  }
  io::Printer::Outdent(this->printer_);
  io::Printer::Print<>(this->printer_,"],\n");
  options_string._M_dataplus._M_p = (pointer)&options_string.field_2;
  options_string._M_string_length = 0;
  options_string.field_2._M_local_buf[0] = '\0';
  MessageLite::SerializeToString(*(MessageLite **)(message_descriptor + 0x20),&options_string);
  pPVar3 = this->printer_;
  OptionsValue((string *)&edp,this,&options_string);
  local_258._M_dataplus._M_p = "False";
  if (0 < *(int *)(message_descriptor + 0x78)) {
    local_258._M_dataplus._M_p = "True";
  }
  (anonymous_namespace)::StringifySyntax_abi_cxx11_
            (&options_string_1,
             (_anonymous_namespace_ *)(ulong)*(uint *)(*(long *)(message_descriptor + 0x10) + 0x3c),
             syntax);
  io::Printer::
  Print<char[14],std::__cxx11::string,char[11],char_const*,char[7],std::__cxx11::string>
            (pPVar3,
             "serialized_options=$options_value$,\nis_extendable=$extendable$,\nsyntax=\'$syntax$\'"
             ,(char (*) [14])"options_value",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&edp,
             (char (*) [11])"extendable",(char **)&local_258,(char (*) [7])0x393740,
             &options_string_1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)options_string_1._M_dataplus._M_p != &options_string_1.field_2) {
    operator_delete(options_string_1._M_dataplus._M_p);
  }
  if (edp.super_Message.super_MessageLite._vptr_MessageLite != (MessageLite)&edp._has_bits_) {
    operator_delete((void *)edp.super_Message.super_MessageLite._vptr_MessageLite);
  }
  io::Printer::Print<>(this->printer_,",\n");
  io::Printer::Print<>(this->printer_,"extension_ranges=[");
  if (0 < *(int *)(message_descriptor + 0x78)) {
    lVar8 = 4;
    lVar10 = 0;
    do {
      lVar4 = *(long *)(message_descriptor + 0x48);
      pPVar3 = this->printer_;
      pHVar2 = &edp._has_bits_;
      edp.super_Message.super_MessageLite._vptr_MessageLite = (MessageLite)(MessageLite)pHVar2;
      pcVar7 = FastInt32ToBufferLeft(*(int32 *)(lVar4 + -4 + lVar8),(char *)pHVar2);
      edp._internal_metadata_.
      super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
      .ptr_ = (InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               )(pcVar7 + -(long)pHVar2);
      local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_258,edp.super_Message.super_MessageLite._vptr_MessageLite,
                 (char *)((long)edp._internal_metadata_.
                                super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                                .ptr_ + (long)edp.super_Message.super_MessageLite._vptr_MessageLite)
                );
      paVar1 = &options_string_1.field_2;
      options_string_1._M_dataplus._M_p = (pointer)paVar1;
      pcVar7 = FastInt32ToBufferLeft(*(int32 *)(lVar4 + lVar8),paVar1->_M_local_buf);
      options_string_1._M_string_length = (long)pcVar7 - (long)paVar1;
      local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1f0,options_string_1._M_dataplus._M_p,
                 options_string_1._M_dataplus._M_p + options_string_1._M_string_length);
      io::Printer::Print<char[6],std::__cxx11::string,char[4],std::__cxx11::string>
                (pPVar3,"($start$, $end$), ",(char (*) [6])0x3a1716,&local_258,
                 (char (*) [4])0x3a1727,&local_1f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        operator_delete(local_1f0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p);
      }
      lVar10 = lVar10 + 1;
      lVar8 = lVar8 + 0x10;
    } while (lVar10 < *(int *)(message_descriptor + 0x78));
  }
  io::Printer::Print<>(this->printer_,"],\n");
  io::Printer::Print<>(this->printer_,"oneofs=[\n");
  io::Printer::Indent(this->printer_);
  if (0 < *(int *)(message_descriptor + 0x6c)) {
    lVar10 = 0;
    lVar8 = 0;
    do {
      lVar4 = *(long *)(message_descriptor + 0x30);
      edp._internal_metadata_.
      super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
      .ptr_ = (InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               )((ulong)edp._internal_metadata_.
                        super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                        .ptr_ & 0xffffffff00000000);
      edp._has_bits_.has_bits_[0] = (uint32  [1])0x0;
      edp._cached_size_.size_.super___atomic_base<int>._M_i = (atomic<int>)0x0;
      edp.field_.super_RepeatedPtrFieldBase.arena_ = (Arena *)&edp._internal_metadata_;
      edp.field_.super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
      options_string_1._M_dataplus._M_p = (pointer)&options_string_1.field_2;
      edp.field_.super_RepeatedPtrFieldBase._8_8_ = edp.field_.super_RepeatedPtrFieldBase.arena_;
      std::__cxx11::string::_M_construct<char_const*>((string *)&options_string_1,"name","");
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&edp,&options_string_1);
      std::__cxx11::string::_M_assign((string *)pmVar6);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)options_string_1._M_dataplus._M_p != &options_string_1.field_2) {
        operator_delete(options_string_1._M_dataplus._M_p);
      }
      options_string_1._M_dataplus._M_p = (pointer)&options_string_1.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&options_string_1,"full_name","");
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&edp,&options_string_1);
      std::__cxx11::string::_M_assign((string *)pmVar6);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)options_string_1._M_dataplus._M_p != &options_string_1.field_2) {
        operator_delete(options_string_1._M_dataplus._M_p);
      }
      paVar1 = &options_string_1.field_2;
      options_string_1._M_dataplus._M_p = (pointer)paVar1;
      pcVar7 = FastInt32ToBufferLeft
                         ((int)((ulong)((lVar4 - *(long *)(*(long *)(lVar4 + 0x10 + lVar10) + 0x30))
                                       + lVar10) >> 4) * -0x55555555,paVar1->_M_local_buf);
      options_string_1._M_string_length = (long)pcVar7 - (long)paVar1;
      local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_258,options_string_1._M_dataplus._M_p,
                 options_string_1._M_dataplus._M_p + options_string_1._M_string_length);
      paVar1 = &local_1f0.field_2;
      local_1f0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"index","");
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&edp,&local_1f0);
      std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_258);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != paVar1) {
        operator_delete(local_1f0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p);
      }
      MessageLite::SerializeAsString_abi_cxx11_(&local_258,*(MessageLite **)(lVar4 + 0x28 + lVar10))
      ;
      OptionsValue(&options_string_1,this,&local_258);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p);
      }
      iVar5 = std::__cxx11::string::compare((char *)&options_string_1);
      if (iVar5 == 0) {
        local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_258,"serialized_options","");
        pmVar6 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)&edp,&local_258);
        std::__cxx11::string::_M_replace((ulong)pmVar6,0,(char *)pmVar6->_M_string_length,0x38f545);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2) goto LAB_00279aaf;
      }
      else {
        std::operator+(&local_258,", serialized_options=",&options_string_1);
        local_1f0._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1f0,"serialized_options","");
        pmVar6 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)&edp,&local_1f0);
        std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_258);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0._M_dataplus._M_p != paVar1) {
          operator_delete(local_1f0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2) {
LAB_00279aaf:
          operator_delete(local_258._M_dataplus._M_p);
        }
      }
      io::Printer::Print(this->printer_,
                         (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&edp,
                         "_descriptor.OneofDescriptor(\n  name=\'$name$\', full_name=\'$full_name$\',\n  index=$index$, containing_type=None, fields=[]$serialized_options$),\n"
                        );
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)options_string_1._M_dataplus._M_p != &options_string_1.field_2) {
        operator_delete(options_string_1._M_dataplus._M_p);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&edp);
      lVar8 = lVar8 + 1;
      lVar10 = lVar10 + 0x30;
    } while (lVar8 < *(int *)(message_descriptor + 0x6c));
  }
  io::Printer::Outdent(this->printer_);
  io::Printer::Print<>(this->printer_,"],\n");
  DescriptorProto::DescriptorProto(&edp);
  PrintSerializedPbInterval<google::protobuf::Descriptor,google::protobuf::DescriptorProto>
            (this,message_descriptor,&edp);
  io::Printer::Outdent(this->printer_);
  io::Printer::Print<>(this->printer_,")\n");
  DescriptorProto::~DescriptorProto(&edp);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)options_string._M_dataplus._M_p != &options_string.field_2) {
    operator_delete(options_string._M_dataplus._M_p);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&m._M_t);
  return;
}

Assistant:

void Generator::PrintDescriptor(const Descriptor& message_descriptor) const {
  PrintNestedDescriptors(message_descriptor);

  printer_->Print("\n");
  printer_->Print("$descriptor_name$ = _descriptor.Descriptor(\n",
                  "descriptor_name",
                  ModuleLevelDescriptorName(message_descriptor));
  printer_->Indent();
  std::map<std::string, std::string> m;
  m["name"] = message_descriptor.name();
  m["full_name"] = message_descriptor.full_name();
  m["file"] = kDescriptorKey;
  const char required_function_arguments[] =
      "name='$name$',\n"
      "full_name='$full_name$',\n"
      "filename=None,\n"
      "file=$file$,\n"
      "containing_type=None,\n";
  printer_->Print(m, required_function_arguments);
  PrintFieldsInDescriptor(message_descriptor);
  PrintExtensionsInDescriptor(message_descriptor);

  // Nested types
  printer_->Print("nested_types=[");
  for (int i = 0; i < message_descriptor.nested_type_count(); ++i) {
    const std::string nested_name =
        ModuleLevelDescriptorName(*message_descriptor.nested_type(i));
    printer_->Print("$name$, ", "name", nested_name);
  }
  printer_->Print("],\n");

  // Enum types
  printer_->Print("enum_types=[\n");
  printer_->Indent();
  for (int i = 0; i < message_descriptor.enum_type_count(); ++i) {
    const std::string descriptor_name =
        ModuleLevelDescriptorName(*message_descriptor.enum_type(i));
    printer_->Print(descriptor_name.c_str());
    printer_->Print(",\n");
  }
  printer_->Outdent();
  printer_->Print("],\n");
  std::string options_string;
  message_descriptor.options().SerializeToString(&options_string);
  printer_->Print(
      "serialized_options=$options_value$,\n"
      "is_extendable=$extendable$,\n"
      "syntax='$syntax$'",
      "options_value", OptionsValue(options_string), "extendable",
      message_descriptor.extension_range_count() > 0 ? "True" : "False",
      "syntax", StringifySyntax(message_descriptor.file()->syntax()));
  printer_->Print(",\n");

  // Extension ranges
  printer_->Print("extension_ranges=[");
  for (int i = 0; i < message_descriptor.extension_range_count(); ++i) {
    const Descriptor::ExtensionRange* range =
        message_descriptor.extension_range(i);
    printer_->Print("($start$, $end$), ", "start", StrCat(range->start),
                    "end", StrCat(range->end));
  }
  printer_->Print("],\n");
  printer_->Print("oneofs=[\n");
  printer_->Indent();
  for (int i = 0; i < message_descriptor.oneof_decl_count(); ++i) {
    const OneofDescriptor* desc = message_descriptor.oneof_decl(i);
    std::map<std::string, std::string> m;
    m["name"] = desc->name();
    m["full_name"] = desc->full_name();
    m["index"] = StrCat(desc->index());
    std::string options_string =
        OptionsValue(desc->options().SerializeAsString());
    if (options_string == "None") {
      m["serialized_options"] = "";
    } else {
      m["serialized_options"] = ", serialized_options=" + options_string;
    }
    printer_->Print(m,
                    "_descriptor.OneofDescriptor(\n"
                    "  name='$name$', full_name='$full_name$',\n"
                    "  index=$index$, containing_type=None, "
                    "fields=[]$serialized_options$),\n");
  }
  printer_->Outdent();
  printer_->Print("],\n");
  // Serialization of proto
  DescriptorProto edp;
  PrintSerializedPbInterval(message_descriptor, edp);

  printer_->Outdent();
  printer_->Print(")\n");
}